

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk_file_transfer.cpp
# Opt level: O2

TonkFile tonk_file_from_buffer
                   (TonkConnection connection,uint32_t channel,char *name,void *data,uint32_t bytes,
                   uint32_t flags)

{
  bool bVar1;
  TonkFileTransfer *this;
  uint8_t *__dest;
  
  if (data == (void *)0x0 || (name == (char *)0x0 || connection == (TonkConnection)0x0)) {
    return (TonkFile)0x0;
  }
  this = (TonkFileTransfer *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (this == (TonkFileTransfer *)0x0) {
    return (TonkFile)0x0;
  }
  TonkFileTransfer::TonkFileTransfer(this);
  this->Channel = channel;
  if (channel - 0x32 < 6) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (5 < channel - 0x96) goto LAB_0013f4cd;
  }
  this->LowPriChannel = bVar1;
  this->Connection = connection;
  std::__cxx11::string::assign((char *)&this->NameStr);
  (this->super_TonkFile_t).Name = (this->NameStr)._M_dataplus._M_p;
  if ((flags & 1) == 0) {
    __dest = (uint8_t *)operator_new__((ulong)bytes,(nothrow_t *)&std::nothrow);
    this->InternalDataCopy = __dest;
    if (__dest == (uint8_t *)0x0) {
LAB_0013f4cd:
      TonkFileTransfer::~TonkFileTransfer(this);
      operator_delete(this);
      return (TonkFile)0x0;
    }
    memcpy(__dest,data,(ulong)bytes);
    this->AppDataPtr = __dest;
  }
  else {
    this->AppDataPtr = (uint8_t *)data;
  }
  (this->super_TonkFile_t).TotalBytes = (ulong)bytes;
  return &this->super_TonkFile_t;
}

Assistant:

TONK_EXPORT TonkFile tonk_file_from_buffer(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const void*          data,  ///< File buffer data pointer
    uint32_t            bytes,  ///< File buffer bytes to send
    uint32_t            flags   ///< Flags for buffer
)
{
    // Input validation
    if (!connection || !name || !data) {
        TONK_DEBUG_BREAK();
        return nullptr;
    }

    TonkFileTransfer* transfer = new (std::nothrow) TonkFileTransfer;

    if (!transfer) {
        return nullptr; // OOM
    }

    // Input validation
    if (!transfer->SetChannel(channel)) {
        delete transfer;
        return nullptr;
    }

    transfer->Connection = connection;
    transfer->NameStr = name;
    transfer->Name = transfer->NameStr.c_str();

    if (flags & TONK_FILE_BUFFER_ZERO_COPY) {
        transfer->AppDataPtr = reinterpret_cast<const uint8_t*>(data);
    }
    else {
        transfer->InternalDataCopy = new (std::nothrow) uint8_t[bytes];

        if (!transfer->InternalDataCopy) {
            delete transfer;
            return nullptr; // OOM
        }

        // Make a copy of the app data
        memcpy(transfer->InternalDataCopy, data, bytes);
        transfer->AppDataPtr = transfer->InternalDataCopy;
    }
    transfer->TotalBytes = bytes;

    return reinterpret_cast<TonkFile>(transfer);
}